

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

void __thiscall icu_63::Calendar::setRelatedYear(Calendar *this,int32_t year)

{
  int iVar1;
  ECalType EVar2;
  undefined4 extraout_var;
  int32_t local_14;
  ECalType type;
  int32_t year_local;
  Calendar *this_local;
  
  iVar1 = (*(this->super_UObject)._vptr_UObject[0x17])();
  EVar2 = getCalendarType((char *)CONCAT44(extraout_var,iVar1));
  switch(EVar2) {
  case CALTYPE_PERSIAN:
    local_14 = year + -0x26e;
    break;
  case CALTYPE_ISLAMIC_CIVIL:
  case CALTYPE_ISLAMIC:
  case CALTYPE_ISLAMIC_UMALQURA:
  case CALTYPE_ISLAMIC_TBLA:
  case CALTYPE_ISLAMIC_RGSA:
    local_14 = firstIslamicStartYearFromGrego(year);
    break;
  case CALTYPE_HEBREW:
    local_14 = year + 0xeb0;
    break;
  case CALTYPE_CHINESE:
    local_14 = year + 0xa4d;
    break;
  case CALTYPE_INDIAN:
    local_14 = year + -0x4f;
    break;
  case CALTYPE_COPTIC:
    local_14 = year + -0x11c;
    break;
  case CALTYPE_ETHIOPIC:
    local_14 = year + -8;
    break;
  case CALTYPE_ETHIOPIC_AMETE_ALEM:
    local_14 = year + 0x1574;
    break;
  default:
    local_14 = year;
    break;
  case CALTYPE_DANGI:
    local_14 = year + 0x91d;
  }
  set(this,UCAL_EXTENDED_YEAR,local_14);
  return;
}

Assistant:

void Calendar::setRelatedYear(int32_t year)
{
    // modify for calendar type
    ECalType type = getCalendarType(getType());
    switch (type) {
        case CALTYPE_PERSIAN:
            year -= 622; break;
        case CALTYPE_HEBREW:
            year += 3760; break;
        case CALTYPE_CHINESE:
            year += 2637; break;
        case CALTYPE_INDIAN:
            year -= 79; break;
        case CALTYPE_COPTIC:
            year -= 284; break;
        case CALTYPE_ETHIOPIC:
            year -= 8; break;
        case CALTYPE_ETHIOPIC_AMETE_ALEM:
            year +=5492; break;
        case CALTYPE_DANGI:
            year += 2333; break;
        case CALTYPE_ISLAMIC_CIVIL:
        case CALTYPE_ISLAMIC:
        case CALTYPE_ISLAMIC_UMALQURA:
        case CALTYPE_ISLAMIC_TBLA:
        case CALTYPE_ISLAMIC_RGSA:
            year = firstIslamicStartYearFromGrego(year); break;
        default:
            // CALTYPE_GREGORIAN
            // CALTYPE_JAPANESE
            // CALTYPE_BUDDHIST
            // CALTYPE_ROC
            // CALTYPE_ISO8601
            // do nothing, EXTENDED_YEAR same as Gregorian
            break;
    }
    // set extended year
    set(UCAL_EXTENDED_YEAR, year);
}